

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O1

ze_result_t
zesGetDeviceExpProcAddrTable(ze_api_version_t version,zes_device_exp_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  zes_pfnDeviceEnumActiveVFExp_t p_Var3;
  ze_result_t zVar4;
  code *UNRECOVERED_JUMPTABLE;
  iterator __begin1;
  undefined8 *puVar5;
  
  puVar5 = (undefined8 *)**(long **)(loader::context + 0x1610);
  puVar1 = (undefined8 *)(*(long **)(loader::context + 0x1610))[1];
  zVar4 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (puVar1 != puVar5) {
    if (pDdiTable == (zes_device_exp_dditable_t *)0x0) {
      zVar4 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    else {
      zVar4 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
      if ((int)version <= *(int *)(loader::context + 0x15c0)) {
        zVar4 = ZE_RESULT_SUCCESS;
        for (; puVar5 != puVar1; puVar5 = puVar5 + 0x1b3) {
          if ((*(int *)(puVar5 + 1) == 0) &&
             (UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar5,"zesGetDeviceExpProcAddrTable"),
             UNRECOVERED_JUMPTABLE != (code *)0x0)) {
            zVar4 = (*UNRECOVERED_JUMPTABLE)(version,puVar5 + 0x139);
          }
        }
        if (zVar4 == ZE_RESULT_SUCCESS) {
          lVar2 = **(long **)(loader::context + 0x1610);
          if (((ulong)(((*(long **)(loader::context + 0x1610))[1] - lVar2 >> 3) * 0x7aff6957aff6957b
                      ) < 2) && (*(char *)(loader::context + 0x1629) != '\x01')) {
            pDdiTable->pfnEnumEnabledVFExp = *(zes_pfnDeviceEnumEnabledVFExp_t *)(lVar2 + 0x9d8);
            p_Var3 = *(zes_pfnDeviceEnumActiveVFExp_t *)(lVar2 + 0x9d0);
            pDdiTable->pfnGetSubDevicePropertiesExp =
                 *(zes_pfnDeviceGetSubDevicePropertiesExp_t *)(lVar2 + 0x9c8);
            pDdiTable->pfnEnumActiveVFExp = p_Var3;
          }
          else {
            pDdiTable->pfnEnumEnabledVFExp = loader::zesDeviceEnumEnabledVFExp;
            pDdiTable->pfnGetSubDevicePropertiesExp = loader::zesDeviceGetSubDevicePropertiesExp;
            pDdiTable->pfnEnumActiveVFExp = loader::zesDeviceEnumActiveVFExp;
          }
          if (*(long *)(loader::context + 0x1618) == 0) {
            zVar4 = ZE_RESULT_SUCCESS;
          }
          else {
            UNRECOVERED_JUMPTABLE =
                 (code *)dlsym(*(long *)(loader::context + 0x1618),"zesGetDeviceExpProcAddrTable");
            zVar4 = ZE_RESULT_ERROR_UNINITIALIZED;
            if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
              zVar4 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
              return zVar4;
            }
          }
        }
      }
    }
  }
  return zVar4;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetDeviceExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_device_exp_dditable_t* pDdiTable            ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->sysmanInstanceDrivers->size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : *loader::context->sysmanInstanceDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zes_pfnGetDeviceExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zesGetDeviceExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.zes.DeviceExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->sysmanInstanceDrivers->size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnEnumEnabledVFExp                         = loader::zesDeviceEnumEnabledVFExp;
            pDdiTable->pfnGetSubDevicePropertiesExp                = loader::zesDeviceGetSubDevicePropertiesExp;
            pDdiTable->pfnEnumActiveVFExp                          = loader::zesDeviceEnumActiveVFExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->sysmanInstanceDrivers->front().dditable.zes.DeviceExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zes_pfnGetDeviceExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zesGetDeviceExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}